

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O1

int pztopology::Pr<pztopology::TPZPoint>::SideNodeLocId(int side,int node)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  char local_19;
  
  iVar3 = side;
  if ((1 < (uint)side) && (iVar3 = node, 1 < (uint)node)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Pr<TFather>::SideNodeLocId inconsistent side or node ",0x35);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,side);
    local_19 = ' ';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
    plVar2 = (long *)std::ostream::operator<<(poVar1,node);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}